

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::
write_padded<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::str_writer<char>>
          (basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>> *this,
          align_spec *spec,str_writer<char> *f)

{
  wchar_t wVar1;
  undefined8 *puVar2;
  long lVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  wchar_t __tmp;
  long lVar7;
  int *piVar8;
  size_t size;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  char *pcVar12;
  ulong uVar13;
  ulong uVar14;
  basic_buffer<wchar_t> *c;
  int iVar20;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  int iVar27;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  
  uVar13 = (ulong)spec->width_;
  uVar9 = f->size_;
  puVar2 = *(undefined8 **)this;
  lVar10 = puVar2[2];
  uVar14 = uVar13 - uVar9;
  if (uVar13 < uVar9 || uVar14 == 0) {
    uVar13 = lVar10 + uVar9;
    if ((ulong)puVar2[3] < uVar13) {
      (**(code **)*puVar2)(puVar2,uVar13);
      uVar9 = f->size_;
    }
    puVar2[2] = uVar13;
    if (0 < (long)uVar9) {
      lVar3 = puVar2[1];
      pcVar12 = f->s;
      uVar9 = uVar9 + 1;
      lVar7 = 0;
      do {
        *(int *)(lVar10 * 4 + lVar3 + lVar7 * 4) = (int)pcVar12[lVar7];
        uVar9 = uVar9 - 1;
        lVar7 = lVar7 + 1;
      } while (1 < uVar9);
    }
  }
  else {
    uVar11 = lVar10 + uVar13;
    if ((ulong)puVar2[3] < uVar11) {
      (**(code **)*puVar2)(puVar2,uVar11);
    }
    puVar2[2] = uVar11;
    auVar6 = _DAT_002350b0;
    auVar5 = _DAT_002350a0;
    auVar4 = _DAT_00235090;
    lVar3 = puVar2[1];
    piVar8 = (int *)(lVar3 + lVar10 * 4);
    wVar1 = spec->fill_;
    if (spec->align_ == ALIGN_CENTER) {
      uVar11 = uVar14 >> 1;
      if (1 < uVar14) {
        piVar8 = piVar8 + uVar11;
        uVar14 = uVar11 + 0x3fffffffffffffff & 0x3fffffffffffffff;
        auVar25._8_4_ = (int)uVar14;
        auVar25._0_8_ = uVar14;
        auVar25._12_4_ = (int)(uVar14 >> 0x20);
        lVar3 = lVar3 + lVar10 * 4;
        lVar10 = 0;
        auVar25 = auVar25 ^ _DAT_002350b0;
        do {
          auVar22._8_4_ = (int)lVar10;
          auVar22._0_8_ = lVar10;
          auVar22._12_4_ = (int)((ulong)lVar10 >> 0x20);
          auVar26 = (auVar22 | auVar5) ^ auVar6;
          iVar20 = auVar25._4_4_;
          if ((bool)(~(auVar26._4_4_ == iVar20 && auVar25._0_4_ < auVar26._0_4_ ||
                      iVar20 < auVar26._4_4_) & 1)) {
            *(wchar_t *)(lVar3 + lVar10 * 4) = wVar1;
          }
          if ((auVar26._12_4_ != auVar25._12_4_ || auVar26._8_4_ <= auVar25._8_4_) &&
              auVar26._12_4_ <= auVar25._12_4_) {
            *(wchar_t *)(lVar3 + 4 + lVar10 * 4) = wVar1;
          }
          auVar22 = (auVar22 | auVar4) ^ auVar6;
          iVar27 = auVar22._4_4_;
          if (iVar27 <= iVar20 && (iVar27 != iVar20 || auVar22._0_4_ <= auVar25._0_4_)) {
            *(wchar_t *)(lVar3 + 8 + lVar10 * 4) = wVar1;
            *(wchar_t *)(lVar3 + 0xc + lVar10 * 4) = wVar1;
          }
          lVar10 = lVar10 + 4;
        } while ((uVar14 - ((uint)(uVar11 + 0x3fffffffffffffff) & 3)) + 4 != lVar10);
      }
      if (0 < (long)f->size_) {
        pcVar12 = f->s;
        uVar14 = f->size_ + 1;
        do {
          *piVar8 = (int)*pcVar12;
          pcVar12 = pcVar12 + 1;
          piVar8 = piVar8 + 1;
          uVar14 = uVar14 - 1;
        } while (1 < uVar14);
      }
      auVar6 = _DAT_002350b0;
      auVar5 = _DAT_002350a0;
      auVar4 = _DAT_00235090;
      uVar13 = (uVar13 * 4 + (uVar9 + uVar11) * -4) - 4;
      auVar26._8_4_ = (int)uVar13;
      auVar26._0_8_ = uVar13;
      auVar26._12_4_ = (int)(uVar13 >> 0x20);
      auVar17._0_8_ = uVar13 >> 2;
      auVar17._8_8_ = auVar26._8_8_ >> 2;
      uVar9 = 0;
      auVar17 = auVar17 ^ _DAT_002350b0;
      do {
        auVar23._8_4_ = (int)uVar9;
        auVar23._0_8_ = uVar9;
        auVar23._12_4_ = (int)(uVar9 >> 0x20);
        auVar25 = (auVar23 | auVar5) ^ auVar6;
        iVar20 = auVar17._4_4_;
        if ((bool)(~(auVar25._4_4_ == iVar20 && auVar17._0_4_ < auVar25._0_4_ ||
                    iVar20 < auVar25._4_4_) & 1)) {
          piVar8[uVar9] = wVar1;
        }
        if ((auVar25._12_4_ != auVar17._12_4_ || auVar25._8_4_ <= auVar17._8_4_) &&
            auVar25._12_4_ <= auVar17._12_4_) {
          piVar8[uVar9 + 1] = wVar1;
        }
        auVar25 = (auVar23 | auVar4) ^ auVar6;
        iVar27 = auVar25._4_4_;
        if (iVar27 <= iVar20 && (iVar27 != iVar20 || auVar25._0_4_ <= auVar17._0_4_)) {
          piVar8[uVar9 + 2] = wVar1;
          piVar8[uVar9 + 3] = wVar1;
        }
        uVar9 = uVar9 + 4;
      } while (((uVar13 >> 2) + 4 & 0x7ffffffffffffffc) != uVar9);
    }
    else if (spec->align_ == ALIGN_RIGHT) {
      uVar13 = (uVar13 * 4 + uVar9 * -4) - 4;
      auVar15._8_4_ = (int)uVar13;
      auVar15._0_8_ = uVar13;
      auVar15._12_4_ = (int)(uVar13 >> 0x20);
      auVar16._0_8_ = uVar13 >> 2;
      auVar16._8_8_ = auVar15._8_8_ >> 2;
      lVar3 = lVar3 + lVar10 * 4;
      uVar9 = 0;
      auVar16 = auVar16 ^ _DAT_002350b0;
      do {
        auVar21._8_4_ = (int)uVar9;
        auVar21._0_8_ = uVar9;
        auVar21._12_4_ = (int)(uVar9 >> 0x20);
        auVar25 = (auVar21 | auVar5) ^ auVar6;
        iVar20 = auVar16._4_4_;
        if ((bool)(~(auVar25._4_4_ == iVar20 && auVar16._0_4_ < auVar25._0_4_ ||
                    iVar20 < auVar25._4_4_) & 1)) {
          *(wchar_t *)(lVar3 + uVar9 * 4) = wVar1;
        }
        if ((auVar25._12_4_ != auVar16._12_4_ || auVar25._8_4_ <= auVar16._8_4_) &&
            auVar25._12_4_ <= auVar16._12_4_) {
          *(wchar_t *)(lVar3 + 4 + uVar9 * 4) = wVar1;
        }
        auVar25 = (auVar21 | auVar4) ^ auVar6;
        iVar27 = auVar25._4_4_;
        if (iVar27 <= iVar20 && (iVar27 != iVar20 || auVar25._0_4_ <= auVar16._0_4_)) {
          *(wchar_t *)(lVar3 + 8 + uVar9 * 4) = wVar1;
          *(wchar_t *)(lVar3 + 0xc + uVar9 * 4) = wVar1;
        }
        uVar9 = uVar9 + 4;
      } while (((uVar13 >> 2) + 4 & 0x7ffffffffffffffc) != uVar9);
      if (0 < (long)f->size_) {
        pcVar12 = f->s;
        uVar9 = f->size_ + 1;
        lVar10 = 0;
        do {
          piVar8[uVar14 + lVar10] = (int)pcVar12[lVar10];
          uVar9 = uVar9 - 1;
          lVar10 = lVar10 + 1;
        } while (1 < uVar9);
      }
    }
    else {
      if (0 < (long)f->size_) {
        pcVar12 = f->s;
        uVar14 = f->size_ + 1;
        do {
          *piVar8 = (int)*pcVar12;
          pcVar12 = pcVar12 + 1;
          piVar8 = piVar8 + 1;
          uVar14 = uVar14 - 1;
        } while (1 < uVar14);
      }
      auVar6 = _DAT_002350b0;
      auVar5 = _DAT_002350a0;
      auVar4 = _DAT_00235090;
      uVar13 = (uVar13 * 4 + uVar9 * -4) - 4;
      auVar18._8_4_ = (int)uVar13;
      auVar18._0_8_ = uVar13;
      auVar18._12_4_ = (int)(uVar13 >> 0x20);
      auVar19._0_8_ = uVar13 >> 2;
      auVar19._8_8_ = auVar18._8_8_ >> 2;
      uVar9 = 0;
      auVar19 = auVar19 ^ _DAT_002350b0;
      do {
        auVar24._8_4_ = (int)uVar9;
        auVar24._0_8_ = uVar9;
        auVar24._12_4_ = (int)(uVar9 >> 0x20);
        auVar25 = (auVar24 | auVar5) ^ auVar6;
        iVar20 = auVar19._4_4_;
        if ((bool)(~(auVar25._4_4_ == iVar20 && auVar19._0_4_ < auVar25._0_4_ ||
                    iVar20 < auVar25._4_4_) & 1)) {
          piVar8[uVar9] = wVar1;
        }
        if ((auVar25._12_4_ != auVar19._12_4_ || auVar25._8_4_ <= auVar19._8_4_) &&
            auVar25._12_4_ <= auVar19._12_4_) {
          piVar8[uVar9 + 1] = wVar1;
        }
        auVar25 = (auVar24 | auVar4) ^ auVar6;
        iVar27 = auVar25._4_4_;
        if (iVar27 <= iVar20 && (iVar27 != iVar20 || auVar25._0_4_ <= auVar19._0_4_)) {
          piVar8[uVar9 + 2] = wVar1;
          piVar8[uVar9 + 3] = wVar1;
        }
        uVar9 = uVar9 + 4;
      } while (((uVar13 >> 2) + 4 & 0x7ffffffffffffffc) != uVar9);
    }
  }
  return;
}

Assistant:

void write_padded(const align_spec &spec, F &&f) {
    unsigned width = spec.width(); // User-perceived width (in code points).
    size_t size = f.size(); // The number of code units.
    size_t num_code_points = width != 0 ? f.width() : size;
    if (width <= num_code_points)
      return f(reserve(size));
    auto &&it = reserve(width + (size - num_code_points));
    char_type fill = static_cast<char_type>(spec.fill());
    std::size_t padding = width - num_code_points;
    if (spec.align() == ALIGN_RIGHT) {
      it = std::fill_n(it, padding, fill);
      f(it);
    } else if (spec.align() == ALIGN_CENTER) {
      std::size_t left_padding = padding / 2;
      it = std::fill_n(it, left_padding, fill);
      f(it);
      it = std::fill_n(it, padding - left_padding, fill);
    } else {
      f(it);
      it = std::fill_n(it, padding, fill);
    }
  }